

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalaha.h
# Opt level: O2

void __thiscall KalahaState<(short)6>::check_invariant(KalahaState<(short)6> *this)

{
  short sVar1;
  short sVar2;
  long lVar3;
  short sVar4;
  
  sVar2 = this->player1_store;
  lVar3 = -0xc;
  while( true ) {
    if (lVar3 == 0) {
      sVar4 = this->player2_store;
      lVar3 = -0xc;
      while( true ) {
        if (lVar3 == 0) {
          if ((int)sVar4 + (int)sVar2 == this->start_seeds * 0xc) {
            return;
          }
          MCTS::assertion_failed
                    ("player1_sum + player2_sum == (num_bins * 2) * start_seeds",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/kalaha.h"
                     ,0x10f);
        }
        sVar1 = *(short *)((long)this->player2_bins + lVar3 + 0xc);
        if (sVar1 < 0) break;
        sVar4 = sVar1 + sVar4;
        lVar3 = lVar3 + 2;
      }
      MCTS::assertion_failed
                ("seed >= 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/kalaha.h"
                 ,0x10d);
    }
    sVar4 = *(short *)((long)this->player2_bins + lVar3);
    if (sVar4 < 0) break;
    sVar2 = sVar4 + sVar2;
    lVar3 = lVar3 + 2;
  }
  MCTS::assertion_failed
            ("seed >= 0",
             "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/kalaha.h"
             ,0x107);
}

Assistant:

void check_invariant() const
	{
		short player1_sum = player1_store;
		for (auto seed: player1_bins) {
			player1_sum += seed;
			attest(seed >= 0);
		}

		short player2_sum = player2_store;
		for (auto seed: player2_bins) {
			player2_sum += seed;
			attest(seed >= 0);
		}
		attest(player1_sum + player2_sum == (num_bins * 2) * start_seeds);
	}